

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result __thiscall wabt::interp::Table::Fill(Table *this,Store *store,u32 offset,Ref ref,u32 size)

{
  int iVar1;
  Object *pOVar2;
  pointer pRVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Enum EVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar6 = _DAT_001cce70;
  auVar5 = _DAT_001cce60;
  pOVar2 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((pOVar2 != (Object *)0x0) && (((ulong)pOVar2 & 1) == 0)) &&
     ((iVar1 = *(int *)&(this->type_).super_ExternType.field_0xc, ref.index == 0 || iVar1 == -0x11
      || ((iVar1 == -0x10 && ((pOVar2->kind_ & ~Foreign) == DefinedFunc)))))) {
    pRVar3 = (this->elements_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(this->elements_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pRVar3 >> 3;
    uVar4 = (ulong)size;
    uVar9 = (ulong)offset;
    EVar7 = Error;
    if (uVar9 <= uVar8 - uVar4 && uVar4 <= uVar8) {
      if (size != 0) {
        uVar8 = uVar4 + 0x1fffffffffffffff & 0x1fffffffffffffff;
        auVar11._8_4_ = (int)uVar8;
        auVar11._0_8_ = uVar8;
        auVar11._12_4_ = (int)(uVar8 >> 0x20);
        lVar10 = 0;
        auVar11 = auVar11 ^ _DAT_001cce70;
        do {
          auVar12._8_4_ = (int)lVar10;
          auVar12._0_8_ = lVar10;
          auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar12 = (auVar12 | auVar5) ^ auVar6;
          if ((bool)(~(auVar12._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar12._0_4_ ||
                      auVar11._4_4_ < auVar12._4_4_) & 1)) {
            pRVar3[uVar9 + lVar10].index = ref.index;
          }
          if ((auVar12._12_4_ != auVar11._12_4_ || auVar12._8_4_ <= auVar11._8_4_) &&
              auVar12._12_4_ <= auVar11._12_4_) {
            pRVar3[uVar9 + lVar10 + 1].index = ref.index;
          }
          lVar10 = lVar10 + 2;
        } while ((uVar8 - ((uint)(uVar4 + 0x1fffffffffffffff) & 1)) + 2 != lVar10);
      }
      EVar7 = Ok;
    }
    return (Result)EVar7;
  }
  __assert_fail("store.HasValueType(ref, type_.element)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                ,0x206,"Result wabt::interp::Table::Fill(Store &, u32, Ref, u32)");
}

Assistant:

Result Table::Fill(Store& store, u32 offset, Ref ref, u32 size) {
  assert(store.HasValueType(ref, type_.element));
  if (IsValidRange(offset, size)) {
    std::fill(elements_.begin() + offset, elements_.begin() + offset + size,
              ref);
    return Result::Ok;
  }
  return Result::Error;
}